

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_HatchLoop::IsValid(ON_HatchLoop *this,ON_TextLog *text_log)

{
  uint uVar1;
  bool local_a1;
  ON_3dPoint local_98;
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  undefined1 local_50 [8];
  ON_BoundingBox box;
  bool rc;
  ON_TextLog *text_log_local;
  ON_HatchLoop *this_local;
  
  box.m_max.z._7_1_ = this->m_p2dCurve != (ON_Curve *)0x0;
  if ((!(bool)box.m_max.z._7_1_) && (text_log != (ON_TextLog *)0x0)) {
    ON_TextLog::Print(text_log,"2d loop curve is nullptr\n");
  }
  if ((box.m_max.z._7_1_ & 1) != 0) {
    uVar1 = (*(this->m_p2dCurve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                      (this->m_p2dCurve,text_log);
    box.m_max.z._7_1_ = (byte)uVar1 & 1;
    if (((uVar1 & 1) == 0) && (text_log != (ON_TextLog *)0x0)) {
      ON_TextLog::Print(text_log,"Loop curve is not valid\n");
    }
  }
  if ((box.m_max.z._7_1_ & 1) != 0) {
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_50);
    ON_Geometry::GetBoundingBox
              (&this->m_p2dCurve->super_ON_Geometry,(ON_BoundingBox *)local_50,false);
    ON_BoundingBox::Max(&local_68,(ON_BoundingBox *)local_50);
    ON_BoundingBox::Min(&local_80,(ON_BoundingBox *)local_50);
    local_a1 = false;
    if ((local_68.z == local_80.z) && (!NAN(local_68.z) && !NAN(local_80.z))) {
      ON_BoundingBox::Max(&local_98,(ON_BoundingBox *)local_50);
      local_a1 = local_98.z == 0.0;
    }
    box.m_max.z._7_1_ = local_a1;
    if ((local_a1 == false) && (text_log != (ON_TextLog *)0x0)) {
      ON_TextLog::Print(text_log,"2d loop curve has non-zero z coordinates\n");
    }
  }
  if ((((box.m_max.z._7_1_ & 1) != 0) && (this->m_type != ltOuter)) && (this->m_type != ltInner)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"Loop type is invalid.\n");
    }
    box.m_max.z._7_1_ = 0;
  }
  return (bool)(box.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_HatchLoop::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_p2dCurve != nullptr;
  if( !rc)
  {
    if( text_log)
      text_log->Print( "2d loop curve is nullptr\n");
  }
  if( rc)
  {
    rc = m_p2dCurve->IsValid( text_log);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "Loop curve is not valid\n");
    }
  }

  if(rc)
  {
  }

  if( rc)
  {
    ON_BoundingBox box;
    m_p2dCurve->GetBoundingBox( box);
    rc = ( box.Max().z == box.Min().z && box.Max().z == 0.0);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "2d loop curve has non-zero z coordinates\n");
    }
  }

  if( rc && m_type != ltOuter && m_type != ltInner)
  {
    if( text_log)
      text_log->Print( "Loop type is invalid.\n");
    rc = false;
  }

  return rc;
}